

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O1

void __thiscall
TPZGenSubStruct::IdentifyEqNumbers
          (TPZGenSubStruct *this,TPZSubCompMesh *sub,TPZVec<int> *global,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *globinv)

{
  int iVar1;
  TNode *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  TPZConnect *pTVar5;
  mapped_type_conflict4 *pmVar6;
  long lVar7;
  ulong nolocal;
  long lVar8;
  uint uVar9;
  int iVar10;
  int local_54;
  TPZCompMesh *local_50;
  TPZChunkVector<TPZConnect,_10> *local_48;
  TPZChunkVector<TPZConnect,_10> *local_40;
  undefined4 local_34;
  
  iVar4 = (sub->super_TPZCompMesh).fConnectVec.super_TPZChunkVector<TPZConnect,_10>.fNElements;
  iVar3 = TPZCompMesh::NEquations(&sub->super_TPZCompMesh);
  local_34 = 0xffffffff;
  (*global->_vptr_TPZVec[2])(global,iVar3);
  uVar9 = (uint)iVar4;
  if (0 < (int)uVar9) {
    local_40 = &(sub->super_TPZCompMesh).fConnectVec.super_TPZChunkVector<TPZConnect,_10>;
    local_50 = ((this->fCMesh).fRef)->fPointer;
    local_48 = &(local_50->fConnectVec).super_TPZChunkVector<TPZConnect,_10>;
    nolocal = 0;
    do {
      iVar4 = TPZSubCompMesh::NodeIndex(sub,nolocal,local_50);
      if ((int)iVar4 != -1) {
        pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[](local_40,nolocal);
        iVar1 = (int)pTVar5->fSequenceNumber;
        pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[](local_48,(long)(int)iVar4);
        pTVar2 = (sub->super_TPZCompMesh).fBlock.fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        lVar8 = (long)pTVar2[iVar1].dim;
        if (0 < lVar8) {
          iVar10 = (local_50->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                   [(int)pTVar5->fSequenceNumber].pos;
          lVar7 = (long)pTVar2[iVar1].pos;
          do {
            global->fStore[lVar7] = iVar10;
            local_54 = iVar10;
            pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](globinv,&local_54);
            *pmVar6 = (mapped_type_conflict4)lVar7;
            lVar7 = lVar7 + 1;
            iVar10 = iVar10 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
      }
      nolocal = nolocal + 1;
    } while (nolocal != (uVar9 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZGenSubStruct::IdentifyEqNumbers(TPZSubCompMesh *sub, TPZVec<int> &global, std::map<int,int> &globinv)
{
	int ncon = sub->ConnectVec().NElements();
	// ncon is the number of connects of the subcompmesh
	TPZCompMesh *subcomp = (TPZCompMesh *) sub;
	global.Resize(subcomp->NEquations(),-1);
	TPZCompMesh *super = fCMesh.operator->();
	int ic;
#ifdef PZ_LOG_STOP
	std::stringstream sout;
	sout << "total submesh connects/glob/loc ";
#endif
	for(ic=0; ic<ncon; ic++)
	{
		int glob = sub->NodeIndex(ic,super);
		// continue is the connect is internal
		if(glob == -1) continue;
		int locseq = sub->ConnectVec()[ic].SequenceNumber();
		int globseq = super->ConnectVec()[glob].SequenceNumber();
		int locpos = sub->Block().Position(locseq);
		int globpos = super->Block().Position(globseq);
		int locsize = sub->Block().Size(locseq);
		//    int globsize = super->Block().Size(globseq);
		int ieq;
		for(ieq =0; ieq<locsize; ieq++)
		{
#ifdef PZ_LOG_STOP
			sout << ic << "/" << globpos+ieq << "/" << locpos+ieq << " ";
#endif
			global[locpos+ieq] = globpos+ieq;
			globinv[globpos+ieq] = locpos+ieq;
		}
	}
#ifdef PZ_LOG_STOP
	LOGPZ_DEBUG(logger,sout.str())
#endif
}